

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::changeRowBoundsInterface
          (Highs *this,HighsIndexCollection *index_collection,double *lower,double *upper)

{
  HighsLogOptions *log_options;
  HighsInt bound_scale;
  HighsIndexCollection *index_collection_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  HighsStatus HVar4;
  HighsStatus HVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  allocator local_131;
  HighsIndexCollection *local_130;
  HighsLogOptions *local_128;
  vector<double,_std::allocator<double>_> local_rowUpper;
  vector<double,_std::allocator<double>_> local_rowLower;
  string local_f0;
  string local_d0;
  string local_b0;
  HighsLogOptions local_90;
  
  local_130 = index_collection;
  uVar3 = dataSize(index_collection);
  if ((int)uVar3 < 1) {
    return kOk;
  }
  std::__cxx11::string::string((string *)&local_b0,"row lower bounds",(allocator *)&local_f0);
  log_options = &(this->options_).super_HighsOptionsStruct.log_options;
  bVar1 = doubleUserDataNotNull(log_options,lower,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_d0,"row upper bounds",(allocator *)&local_f0);
  bVar2 = doubleUserDataNotNull(log_options,upper,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (bVar1 || bVar2) {
    return kError;
  }
  uVar7 = (ulong)uVar3;
  local_128 = log_options;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_rowLower,lower,lower + uVar7,
             (allocator_type *)&local_f0);
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_rowUpper,upper,upper + uVar7,
             (allocator_type *)&local_f0);
  index_collection_00 = local_130;
  if (local_130->is_set_ == true) {
    sortSetData(local_130->set_num_entries_,&local_130->set_,lower,upper,(double *)0x0,
                local_rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,
                local_rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,(double *)0x0);
  }
  HighsLogOptions::HighsLogOptions(&local_90,local_128);
  HVar4 = assessBounds(&this->options_,"row",0,index_collection_00,&local_rowLower,&local_rowUpper,
                       (this->options_).super_HighsOptionsStruct.infinite_bound,(HighsVarType *)0x0)
  ;
  std::__cxx11::string::string((string *)&local_f0,"assessBounds",&local_131);
  HVar5 = interpretCallStatus(&local_90,HVar4,kOk,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::_Function_base::~_Function_base(&local_90.user_callback.super__Function_base);
  HVar4 = kError;
  if (HVar5 != kError) {
    bound_scale = (this->model_).lp_.user_bound_scale_;
    if (bound_scale != 0) {
      bVar1 = boundScaleOk(&local_rowLower,&local_rowUpper,bound_scale,
                           (this->options_).super_HighsOptionsStruct.infinite_bound);
      if (!bVar1) {
        highsLogUser(local_128,kError,"User bound scaling yields infinite bound\n");
        goto LAB_00251b76;
      }
      dVar8 = ldexp(1.0,(this->model_).lp_.user_bound_scale_);
      for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        local_rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] =
             local_rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6] * dVar8;
        local_rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] =
             local_rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6] * dVar8;
      }
    }
    changeLpRowBounds(&(this->model_).lp_,local_130,&local_rowLower,&local_rowUpper);
    setNonbasicStatusInterface(this,local_130,false);
    invalidateModelStatusSolutionAndInfo(this);
    HVar4 = kOk;
    HEkk::updateStatus(&this->ekk_instance_,kNewBounds);
  }
LAB_00251b76:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_rowUpper.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_rowLower.super__Vector_base<double,_std::allocator<double>_>);
  return HVar4;
}

Assistant:

HighsStatus Highs::changeRowBoundsInterface(
    HighsIndexCollection& index_collection, const double* lower,
    const double* upper) {
  HighsInt num_row_bounds = dataSize(index_collection);
  // If a non-positive number of costs (may) need changing nothing needs to be
  // done
  if (num_row_bounds <= 0) return HighsStatus::kOk;
  bool null_data = false;
  null_data =
      doubleUserDataNotNull(options_.log_options, lower, "row lower bounds") ||
      null_data;
  null_data =
      doubleUserDataNotNull(options_.log_options, upper, "row upper bounds") ||
      null_data;
  if (null_data) return HighsStatus::kError;
  // Take a copy of the cost that can be normalised
  std::vector<double> local_rowLower{lower, lower + num_row_bounds};
  std::vector<double> local_rowUpper{upper, upper + num_row_bounds};
  // If changing the bounds for a set of rows, ensure that the
  // set and data are in ascending order
  if (index_collection.is_set_)
    sortSetData(index_collection.set_num_entries_, index_collection.set_, lower,
                upper, NULL, local_rowLower.data(), local_rowUpper.data(),
                NULL);
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(
      options_.log_options,
      assessBounds(options_, "row", 0, index_collection, local_rowLower,
                   local_rowUpper, options_.infinite_bound),
      return_status, "assessBounds");
  if (return_status == HighsStatus::kError) return return_status;
  HighsLp& lp = model_.lp_;
  if (lp.user_bound_scale_) {
    // Assess and apply any user bound scaling
    if (!boundScaleOk(local_rowLower, local_rowUpper, lp.user_bound_scale_,
                      options_.infinite_bound)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "User bound scaling yields infinite bound\n");
      return HighsStatus::kError;
    }
    double bound_scale_value = std::pow(2, lp.user_bound_scale_);
    for (HighsInt iRow = 0; iRow < num_row_bounds; iRow++) {
      local_rowLower[iRow] *= bound_scale_value;
      local_rowUpper[iRow] *= bound_scale_value;
    }
  }

  changeLpRowBounds(lp, index_collection, local_rowLower, local_rowUpper);
  // Update HiGHS basis status and (any) simplex move status of
  // nonbasic variables whose bounds have changed
  setNonbasicStatusInterface(index_collection, false);
  // Deduce the consequences of new row bounds
  invalidateModelStatusSolutionAndInfo();
  // Determine any implications for simplex data
  ekk_instance_.updateStatus(LpAction::kNewBounds);
  return HighsStatus::kOk;
}